

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::filter(Fl_File_Chooser *this,char *p)

{
  int iVar1;
  char *__ptr;
  char *pcVar2;
  bool bVar3;
  char local_838 [8];
  char temp [2048];
  char *pcStack_30;
  int allfiles;
  char *end;
  char *start;
  char *copyp;
  char *p_local;
  Fl_File_Chooser *this_local;
  
  if ((p == (char *)0x0) || (copyp = p, *p == '\0')) {
    copyp = "*";
  }
  __ptr = strdup(copyp);
  Fl_Menu_::clear(&this->showChoice->super_Fl_Menu_);
  temp[0x7fc] = '\0';
  temp[0x7fd] = '\0';
  temp[0x7fe] = '\0';
  temp[0x7ff] = '\0';
  end = __ptr;
  while( true ) {
    bVar3 = false;
    if (end != (char *)0x0) {
      bVar3 = *end != '\0';
    }
    if (!bVar3) break;
    pcVar2 = strchr(end,9);
    pcStack_30 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcStack_30 = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    iVar1 = strcmp(end,"*");
    if (iVar1 == 0) {
      Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,all_files_label);
      temp[0x7fc] = '\x01';
      temp[0x7fd] = '\0';
      temp[0x7fe] = '\0';
      temp[0x7ff] = '\0';
    }
    else {
      quote_pathname(local_838,end,0x800);
      Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,local_838);
      pcVar2 = strstr(end,"(*)");
      if (pcVar2 != (char *)0x0) {
        temp[0x7fc] = '\x01';
        temp[0x7fd] = '\0';
        temp[0x7fe] = '\0';
        temp[0x7ff] = '\0';
      }
    }
    end = pcStack_30;
  }
  free(__ptr);
  if (temp._2044_4_ == 0) {
    Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,all_files_label);
  }
  Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,custom_filter_label);
  Fl_Choice::value(this->showChoice,0);
  showChoiceCB(this);
  return;
}

Assistant:

void
Fl_File_Chooser::filter(const char *p)		// I - Pattern(s)
{
  char		*copyp,				// Copy of pattern
		*start,				// Start of pattern
		*end;				// End of pattern
  int		allfiles;			// Do we have a "*" pattern?
  char		temp[FL_PATH_MAX];			// Temporary pattern string


  // Make sure we have a pattern...
  if (!p || !*p) p = "*";

  // Copy the pattern string...
  copyp = strdup(p);

  // Separate the pattern string as necessary...
  showChoice->clear();

  for (start = copyp, allfiles = 0; start && *start; start = end) {
    end = strchr(start, '\t');
    if (end) *end++ = '\0';

    if (strcmp(start, "*") == 0) {
      showChoice->add(all_files_label);
      allfiles = 1;
    } else {
      quote_pathname(temp, start, sizeof(temp));
      showChoice->add(temp);
      if (strstr(start, "(*)") != NULL) allfiles = 1;
    }
  }

  free(copyp);

  if (!allfiles) showChoice->add(all_files_label);

  showChoice->add(custom_filter_label);
  
  showChoice->value(0);
  showChoiceCB();
}